

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtMatrix3x3.h
# Opt level: O2

cbtVector3 operator*(cbtVector3 *v,cbtMatrix3x3 *m)

{
  undefined1 auVar1 [16];
  cbtScalar cVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  cbtVector3 cVar5;
  
  cVar2 = cbtMatrix3x3::tdotx(m,v);
  cVar3 = cbtMatrix3x3::tdoty(m,v);
  cVar4 = cbtMatrix3x3::tdotz(m,v);
  auVar1._4_4_ = extraout_XMM0_Db;
  auVar1._0_4_ = cVar2;
  auVar1._8_4_ = extraout_XMM0_Dc;
  auVar1._12_4_ = extraout_XMM0_Dd;
  auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)cVar3),0x10);
  cVar5.m_floats._0_8_ = auVar1._0_8_;
  cVar5.m_floats[2] = cVar4;
  cVar5.m_floats[3] = 0.0;
  return (cbtVector3)cVar5.m_floats;
}

Assistant:

SIMD_FORCE_INLINE cbtVector3
operator*(const cbtVector3& v, const cbtMatrix3x3& m)
{
#if defined BT_USE_SIMD_VECTOR3 && (defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE))

	const __m128 vv = v.mVec128;

	__m128 c0 = bt_splat_ps(vv, 0);
	__m128 c1 = bt_splat_ps(vv, 1);
	__m128 c2 = bt_splat_ps(vv, 2);

	c0 = _mm_mul_ps(c0, _mm_and_ps(m[0].mVec128, btvFFF0fMask));
	c1 = _mm_mul_ps(c1, _mm_and_ps(m[1].mVec128, btvFFF0fMask));
	c0 = _mm_add_ps(c0, c1);
	c2 = _mm_mul_ps(c2, _mm_and_ps(m[2].mVec128, btvFFF0fMask));

	return cbtVector3(_mm_add_ps(c0, c2));
#elif defined(BT_USE_NEON)
	const float32x4_t vv = v.mVec128;
	const float32x2_t vlo = vget_low_f32(vv);
	const float32x2_t vhi = vget_high_f32(vv);

	float32x4_t c0, c1, c2;

	c0 = (float32x4_t)vandq_s32((int32x4_t)m[0].mVec128, btvFFF0Mask);
	c1 = (float32x4_t)vandq_s32((int32x4_t)m[1].mVec128, btvFFF0Mask);
	c2 = (float32x4_t)vandq_s32((int32x4_t)m[2].mVec128, btvFFF0Mask);

	c0 = vmulq_lane_f32(c0, vlo, 0);
	c1 = vmulq_lane_f32(c1, vlo, 1);
	c2 = vmulq_lane_f32(c2, vhi, 0);
	c0 = vaddq_f32(c0, c1);
	c0 = vaddq_f32(c0, c2);

	return cbtVector3(c0);
#else
	return cbtVector3(m.tdotx(v), m.tdoty(v), m.tdotz(v));
#endif
}